

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  int32_t *piVar1;
  GeneratorContextImpl *pGVar2;
  GeneratedCodeInfo_Annotation *from;
  bool bVar3;
  bool bVar4;
  reference ppVar5;
  Rep *pRVar6;
  GeneratedCodeInfo_Annotation *this_00;
  ostream *poVar7;
  AlphaNum *b;
  RepeatedPtrFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar8;
  long lVar9;
  string *output;
  iterator iVar10;
  string_view data;
  string_view input;
  GeneratedCodeInfo new_metadata;
  GeneratedCodeInfo metadata;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_120;
  size_t local_110;
  undefined1 local_108 [48];
  undefined1 local_d8 [16];
  anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 local_c8;
  string local_a8;
  undefined1 local_88 [48];
  _Head_base<0UL,_const_char_(&)[1],_false> local_58;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
  local_50;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  local_48;
  
  pGVar2 = this->directory_;
  local_d8._8_8_ = (this->filename_)._M_dataplus._M_p;
  b = (AlphaNum *)(this->filename_)._M_string_length;
  local_108._0_8_ = &DAT_00000008;
  local_108._8_8_ = (long)".java.pb.meta" + 5;
  local_110 = insertion_length;
  local_d8._0_8_ = b;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_88,(lts_20250127 *)local_d8,(AlphaNum *)local_108,b);
  iVar10 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
           ::find<std::__cxx11::string>
                     ((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                       *)&pGVar2->files_,(string *)local_88);
  local_120.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
        *)iVar10.node_;
  local_120.position_ = iVar10.position_;
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  iVar10 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                  *)&this->directory_->files_);
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
          ::Equals(&local_120,(const_iterator)iVar10);
  if ((bVar3) && (*(int *)((long)&(this->info_to_insert_).field_0 + 8) == 0)) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_d8,(Arena *)0x0);
  iVar10 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                  *)&this->directory_->files_);
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
          ::Equals(&local_120,(const_iterator)iVar10);
  if (bVar3) {
    pGVar2 = this->directory_;
    local_108._8_8_ = (this->filename_)._M_dataplus._M_p;
    local_108._0_8_ = (this->filename_)._M_string_length;
    local_88._0_8_ = &DAT_00000008;
    local_88._8_8_ = ".pb.meta";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a8,(lts_20250127 *)local_108,(AlphaNum *)local_88,(AlphaNum *)local_108._0_8_)
    ;
    local_58._M_head_impl = (char (*) [1])0x50989c;
    local_50._M_head_impl = &local_a8;
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
    ::
    insert_unique<std::__cxx11::string,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<char_const(&)[1]>>
              (&local_48,
               (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                *)&pGVar2->files_,&local_a8,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_50,(tuple<const_char_(&)[1]> *)&local_58);
    ppVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
             ::operator*(&local_48.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    output = &ppVar5->second;
LAB_0018006e:
    bVar3 = false;
  }
  else {
    ppVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
             ::operator*(&local_120);
    data._M_str = (ppVar5->second)._M_dataplus._M_p;
    data._M_len = (ppVar5->second)._M_string_length;
    bVar3 = MessageLite::ParseFromString((MessageLite *)local_d8,data);
    output = &ppVar5->second;
    if (bVar3) goto LAB_0018006e;
    input._M_str = local_d8;
    input._M_len = (size_t)(ppVar5->second)._M_dataplus._M_p;
    bVar4 = TextFormat::ParseFromString
                      ((TextFormat *)(ppVar5->second)._M_string_length,input,(Message *)b);
    bVar3 = true;
    if (!bVar4) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,".pb.meta: Could not parse metadata as wire or text format.",0x3a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      goto LAB_001801a2;
    }
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_108,(Arena *)0x0);
  this_01 = (RepeatedPtrFieldBase *)(local_d8 + 0x10);
  pRVar8 = this_01;
  if ((local_c8._0_1_ & 1) != 0) {
    pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar8 = (RepeatedPtrFieldBase *)pRVar6->elements;
  }
  if ((local_c8._0_1_ & 1) != 0) {
    pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    this_01 = (RepeatedPtrFieldBase *)pRVar6->elements;
  }
  if (pRVar8 == (RepeatedPtrFieldBase *)
                (&this_01->tagged_rep_or_elem_ +
                local_c8._impl_.annotation_.super_RepeatedPtrFieldBase.current_size_)) {
LAB_00180155:
    InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                      (GeneratedCodeInfo *)local_108);
  }
  else {
    lVar9 = 0;
    bVar4 = false;
    do {
      from = (GeneratedCodeInfo_Annotation *)pRVar8->tagged_rep_or_elem_;
      if ((insertion_offset <= (ulong)(long)(from->field_0)._impl_.begin_) && (!bVar4)) {
        InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                          (GeneratedCodeInfo *)local_108);
        lVar9 = lVar9 + local_110;
        bVar4 = true;
      }
      this_00 = (GeneratedCodeInfo_Annotation *)
                protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                          ((RepeatedPtrFieldBase *)(local_108 + 0x10),
                           Arena::DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
      GeneratedCodeInfo_Annotation::CopyFrom(this_00,from);
      piVar1 = &(this_00->field_0)._impl_.begin_;
      *piVar1 = *piVar1 + (int)lVar9;
      piVar1 = &(this_00->field_0)._impl_.end_;
      *piVar1 = *piVar1 + (int)lVar9;
      *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 6;
      pRVar8 = (RepeatedPtrFieldBase *)&pRVar8->current_size_;
    } while (pRVar8 != (RepeatedPtrFieldBase *)
                       (&this_01->tagged_rep_or_elem_ +
                       local_c8._impl_.annotation_.super_RepeatedPtrFieldBase.current_size_));
    if (!bVar4) goto LAB_00180155;
  }
  if (bVar3) {
    TextFormat::PrintToString((Message *)local_108,output);
  }
  else {
    MessageLite::SerializeToString((MessageLite *)local_108,output);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_108);
LAB_001801a2:
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_d8);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(absl::StrCat(filename_, ".pb.meta"));
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.try_emplace(absl::StrCat(filename_, ".pb.meta"), "")
             .first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (static_cast<size_t>(source_annotation.begin()) >= insertion_offset &&
        !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}